

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<int>::FindEQ(set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
                   BpTree<int> *this,int k)

{
  Addr p;
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  bool bVar4;
  int local_94;
  int pos;
  Addr AStack_88;
  int i;
  Addr Cp;
  IndexNode<int> C;
  int k_local;
  BpTree<int> *this_local;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ret;
  
  C.self.FileOff = k;
  IndexNode<int>::IndexNode((IndexNode<int> *)&Cp,this->N);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set(__return_storage_ptr__);
  local_94 = FindFirstKey(this,C.self.FileOff,&stack0xffffffffffffff78);
  FindNode(this,AStack_88,(IndexNode<int> *)&Cp);
  if (local_94 != -1) {
    do {
      while( true ) {
        pos = local_94;
        while( true ) {
          bVar4 = false;
          if (pos < this->N + -1) {
            pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)
                                &C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)pos);
            bVar4 = false;
            if (*pvVar1 == '1') {
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)&C,(long)pos);
              bVar4 = *pvVar2 == C.self.FileOff;
            }
          }
          if (!bVar4) break;
          pvVar3 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)pos);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::insert
                    (__return_storage_ptr__,pvVar3);
          pos = pos + 1;
        }
        if (((pos == this->N + -1) ||
            (pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)
                                 &C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)pos),
            *pvVar1 == '0')) &&
           (pvVar3 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                               ((vector<Addr,_std::allocator<Addr>_> *)
                                &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 field_0x10,(long)(this->N + -1)), pvVar3->FileOff == -1))
        goto LAB_001709c0;
        if ((pos != this->N + -1) &&
           (pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)
                                &C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)pos),
           *pvVar1 != '0')) break;
        local_94 = 0;
        pvVar3 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)(this->N + -1));
        p.BlockNum = pvVar3->BlockNum;
        p.FileOff = pvVar3->FileOff;
        FindNode(this,p,(IndexNode<int> *)&Cp);
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&C,(long)pos);
    } while (*pvVar2 == C.self.FileOff);
  }
LAB_001709c0:
  IndexNode<int>::~IndexNode((IndexNode<int> *)&Cp);
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindEQ(K k) {
	IndexNode<K> C(N);
	Addr Cp;
	int i;
	set<Addr> ret;
	int pos = this->FindFirstKey(k, Cp);
	this->FindNode(Cp, C);			//C.k[pos]�ǵ�һ����ֵΪk�ĵط�
	if (pos == -1)
		return ret;					//�Ҳ����ü�ֵ�����ؿ�����
	while (1) {
		for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] == k; i++) {
			ret.insert(C.p[i]);
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;									//��ͷ��
		}
		else if (i == N - 1 || C.v[i] == '0') {		//��Ҷ���������һ�����
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
		else if (C.k[i] != k) {
			break;									//�ҵ���һ���������������λ��
		}
	}
	return ret;
}